

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIF.cpp
# Opt level: O0

Event * __thiscall LIF::update(LIF *this,double n_dt)

{
  double *pdVar1;
  Event *pEVar2;
  LIF *in_RDI;
  double in_XMM0_Qa;
  SpikeEvent *in_stack_ffffffffffffffe0;
  
  in_RDI->dt = in_XMM0_Qa;
  if (in_RDI->t_rest <= 0.0) {
    pdVar1 = &in_RDI->param->u_thresh;
    if (*pdVar1 <= in_RDI->u && in_RDI->u != *pdVar1) {
      fire(in_RDI);
      pEVar2 = (Event *)operator_new(0x28);
      SpikeEvent::SpikeEvent(in_stack_ffffffffffffffe0);
      return pEVar2;
    }
    integrate(in_RDI);
  }
  else {
    rest(in_RDI);
  }
  pEVar2 = (Event *)operator_new(0x18);
  NoEvent::NoEvent((NoEvent *)in_stack_ffffffffffffffe0);
  return pEVar2;
}

Assistant:

Event* LIF::update(double n_dt) {
    dt = n_dt;
    if(t_rest > 0.0) {
        rest();
    }
    else if(u > param->u_thresh) {
        fire();
        return new SpikeEvent();
    }
    else {
        integrate();
    }
    return new NoEvent();
}